

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cmdline::parser::get<std::__cxx11::string>(parser *this,string *name)

{
  size_type sVar1;
  undefined8 uVar2;
  pointer ppVar3;
  option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
  *in_stack_ffffffffffffff38;
  string *in_stack_ffffffffffffff48;
  cmdline_error *in_stack_ffffffffffffff50;
  cmdline_error *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                   *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (sVar1 == 0) {
    uVar2 = __cxa_allocate_exception(0x28);
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    cmdline_error::cmdline_error(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    __cxa_throw(uVar2,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
  ::find(in_stack_ffffffffffffff38,(key_type *)0x12b1ed);
  ppVar3 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>
                         *)0x12b1fc);
  this_01 = (cmdline_error *)ppVar3->second;
  if (this_01 == (cmdline_error *)0x0) {
    this_00 = (option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  }
  else {
    this_00 = (option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)__dynamic_cast(this_01,&option_base::typeinfo,
                                &option_with_value<std::__cxx11::string>::typeinfo,0);
  }
  if (this_00 ==
      (option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    __rhs = (char *)__cxa_allocate_exception(0x28);
    std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                   __rhs);
    cmdline_error::cmdline_error(this_01,(string *)this_00);
    __cxa_throw(__rhs,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  pbVar4 = option_with_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get(this_00);
  return pbVar4;
}

Assistant:

const T& get(const std::string& name) const {
        if (options.count(name) == 0) throw cmdline_error("there is no flag: --" + name);
        const option_with_value<T>* p = dynamic_cast<const option_with_value<T>*>(options.find(name)->second);
        if (p == NULL) throw cmdline_error("type mismatch flag '" + name + "'");
        return p->get();
    }